

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

lws_http_mount * lws_find_mount(lws *wsi,char *uri_ptr,int uri_len)

{
  byte bVar1;
  int iVar2;
  lws_http_mount *plVar3;
  lws_http_mount *plVar4;
  byte bVar5;
  
  plVar3 = (wsi->vhost->http).mount_list;
  bVar5 = 0;
  if (plVar3 == (lws_http_mount *)0x0) {
    plVar4 = (lws_http_mount *)0x0;
  }
  else {
    plVar4 = (lws_http_mount *)0x0;
    do {
      bVar1 = plVar3->mountpoint_len;
      if ((((int)(uint)bVar1 <= uri_len) &&
          (iVar2 = strncmp(uri_ptr,plVar3->mountpoint,(ulong)bVar1), iVar2 == 0)) &&
         ((uri_ptr[bVar1] == '\0' || ((uri_ptr[bVar1] == '/' || (bVar1 == 1)))))) {
        if (plVar3->origin_protocol == '\x03') {
LAB_00134542:
          if (plVar3->mountpoint_len <= bVar5) goto LAB_00134553;
        }
        else if (plVar3->origin_protocol != '\x06') {
          iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI);
          if (((((iVar2 == 0) && (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_POST_URI), iVar2 == 0))
               && (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HEAD_URI), iVar2 == 0)) &&
              (((wsi->field_0x2dc & 2) == 0 ||
               (iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar2 == 0)))) &&
             (plVar3->protocol == (char *)0x0)) goto LAB_00134553;
          goto LAB_00134542;
        }
        bVar5 = plVar3->mountpoint_len;
        plVar4 = plVar3;
      }
LAB_00134553:
      plVar3 = plVar3->mount_next;
    } while (plVar3 != (lws_http_mount *)0x0);
  }
  return plVar4;
}

Assistant:

const struct lws_http_mount *
lws_find_mount(struct lws *wsi, const char *uri_ptr, int uri_len)
{
	const struct lws_http_mount *hm, *hit = NULL;
	int best = 0;

	hm = wsi->vhost->http.mount_list;
	while (hm) {
		if (uri_len >= hm->mountpoint_len &&
		    !strncmp(uri_ptr, hm->mountpoint, hm->mountpoint_len) &&
		    (uri_ptr[hm->mountpoint_len] == '\0' ||
		     uri_ptr[hm->mountpoint_len] == '/' ||
		     hm->mountpoint_len == 1)
		    ) {
			if (hm->origin_protocol == LWSMPRO_CALLBACK ||
			    ((hm->origin_protocol == LWSMPRO_CGI ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_POST_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_HEAD_URI) ||
			     (wsi->mux_substream &&
				lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_PATH)) ||
			     hm->protocol) &&
			    hm->mountpoint_len > best)) {
				best = hm->mountpoint_len;
				hit = hm;
			}
		}
		hm = hm->mount_next;
	}

	return hit;
}